

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::IntegerStateQueryTests::init
          (IntegerStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  Context *pCVar4;
  int iVar5;
  GetBooleanVerifier *pGVar6;
  undefined4 extraout_var;
  GetIntegerVerifier *pGVar7;
  undefined4 extraout_var_00;
  GetInteger64Verifier *pGVar8;
  undefined4 extraout_var_01;
  GetFloatVerifier *pGVar9;
  undefined4 extraout_var_02;
  ApiCase *pAVar10;
  long *plVar11;
  long lVar12;
  TestContext *pTVar13;
  ApiCase *this_00;
  TestNode *pTVar14;
  long *extraout_RAX;
  long *plVar15;
  int _verifierNdx_1;
  int _verifierNdx;
  long lVar16;
  IntegerStateQueryTests *pIVar17;
  StateVerifier *normalVerifiers [4];
  StateVerifier *implementationLimitVerifiers [3];
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  IntegerStateQueryTests *local_d0;
  Context *local_c8;
  ApiCase *local_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  GetBooleanVerifier *local_98;
  GetIntegerVerifier *local_90;
  undefined1 local_88 [40];
  long local_60 [2];
  long local_50;
  GetBooleanVerifier *local_48;
  GetInteger64Verifier *local_40;
  GetFloatVerifier *local_38;
  
  pGVar6 = (GetBooleanVerifier *)operator_new(0x28);
  iVar5 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(pGVar6->super_StateVerifier).super_CallLogWrapper,
             (Functions *)CONCAT44(extraout_var,iVar5),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  (pGVar6->super_StateVerifier).m_testNamePostfix = "_getboolean";
  (pGVar6->super_StateVerifier).super_CallLogWrapper.m_enableLog = true;
  (pGVar6->super_StateVerifier)._vptr_StateVerifier = (_func_int **)&PTR__StateVerifier_00d30828;
  this->m_verifierBoolean = pGVar6;
  pGVar7 = (GetIntegerVerifier *)operator_new(0x28);
  iVar5 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(pGVar7->super_StateVerifier).super_CallLogWrapper,
             (Functions *)CONCAT44(extraout_var_00,iVar5),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  (pGVar7->super_StateVerifier).m_testNamePostfix = "_getinteger";
  (pGVar7->super_StateVerifier).super_CallLogWrapper.m_enableLog = true;
  (pGVar7->super_StateVerifier)._vptr_StateVerifier = (_func_int **)&PTR__StateVerifier_00d30890;
  this->m_verifierInteger = pGVar7;
  pGVar8 = (GetInteger64Verifier *)operator_new(0x28);
  iVar5 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(pGVar8->super_StateVerifier).super_CallLogWrapper,
             (Functions *)CONCAT44(extraout_var_01,iVar5),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  (pGVar8->super_StateVerifier).m_testNamePostfix = "_getinteger64";
  (pGVar8->super_StateVerifier).super_CallLogWrapper.m_enableLog = true;
  (pGVar8->super_StateVerifier)._vptr_StateVerifier = (_func_int **)&PTR__StateVerifier_00d308f8;
  this->m_verifierInteger64 = pGVar8;
  pGVar9 = (GetFloatVerifier *)operator_new(0x28);
  iVar5 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(pGVar9->super_StateVerifier).super_CallLogWrapper,
             (Functions *)CONCAT44(extraout_var_02,iVar5),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  (pGVar9->super_StateVerifier).m_testNamePostfix = "_getfloat";
  (pGVar9->super_StateVerifier).super_CallLogWrapper.m_enableLog = true;
  (pGVar9->super_StateVerifier)._vptr_StateVerifier = (_func_int **)&PTR__StateVerifier_00d30960;
  this->m_verifierFloat = pGVar9;
  local_48 = this->m_verifierBoolean;
  local_40 = this->m_verifierInteger64;
  local_38 = pGVar9;
  lVar12 = 0;
  local_d0 = this;
  do {
    local_88._16_8_ = lVar12;
    lVar16 = 0;
    do {
      pTVar13 = (TestContext *)(&local_48)[lVar16];
      pAVar10 = (ApiCase *)operator_new(0xa8);
      local_c8 = (local_d0->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,(&PTR_anon_var_dwarf_82b26c_00d309f0)[lVar12 * 3],
                 (allocator<char> *)&local_f0);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_110);
      pGVar6 = (GetBooleanVerifier *)(plVar11 + 2);
      if ((GetBooleanVerifier *)*plVar11 == pGVar6) {
        local_88._0_8_ = (pGVar6->super_StateVerifier)._vptr_StateVerifier;
        local_88._8_8_ = plVar11[3];
        local_98 = (GetBooleanVerifier *)local_88;
      }
      else {
        local_88._0_8_ = (pGVar6->super_StateVerifier)._vptr_StateVerifier;
        local_98 = (GetBooleanVerifier *)*plVar11;
      }
      local_90 = (GetIntegerVerifier *)plVar11[1];
      *plVar11 = (long)pGVar6;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      uVar1 = (&DAT_00d30a00)[lVar12 * 6];
      uVar2 = (&DAT_00d30a04)[lVar12 * 6];
      local_c0 = (ApiCase *)pTVar13;
      ApiCase::ApiCase(pAVar10,local_c8,(char *)local_98,
                       (&PTR_anon_var_dwarf_88ec9d_00d309f8)[lVar12 * 3]);
      (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_00d311d0;
      *(undefined4 *)&pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = uVar1
      ;
      *(undefined4 *)
       ((long)&pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) = uVar2;
      pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)local_c0;
      tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
      if (local_98 != (GetBooleanVerifier *)local_88) {
        operator_delete(local_98,local_88._0_8_ + 1);
      }
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != 3);
    lVar12 = local_88._16_8_ + 1;
  } while (lVar12 != 0x28);
  lVar12 = 0;
  do {
    local_88._16_8_ = lVar12;
    lVar16 = 0;
    do {
      pTVar13 = (TestContext *)(&local_48)[lVar16];
      pAVar10 = (ApiCase *)operator_new(0xa8);
      local_c8 = (local_d0->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,(&PTR_anon_var_dwarf_169354_00d30db0)[lVar12 * 3],
                 (allocator<char> *)&local_f0);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_110);
      pGVar6 = (GetBooleanVerifier *)(plVar11 + 2);
      if ((GetBooleanVerifier *)*plVar11 == pGVar6) {
        local_88._0_8_ = (pGVar6->super_StateVerifier)._vptr_StateVerifier;
        local_88._8_8_ = plVar11[3];
        local_98 = (GetBooleanVerifier *)local_88;
      }
      else {
        local_88._0_8_ = (pGVar6->super_StateVerifier)._vptr_StateVerifier;
        local_98 = (GetBooleanVerifier *)*plVar11;
      }
      local_90 = (GetIntegerVerifier *)plVar11[1];
      *plVar11 = (long)pGVar6;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      uVar1 = (&DAT_00d30dc0)[lVar12 * 6];
      uVar2 = (&DAT_00d30dc4)[lVar12 * 6];
      local_c0 = (ApiCase *)pTVar13;
      ApiCase::ApiCase(pAVar10,local_c8,(char *)local_98,
                       (&PTR_anon_var_dwarf_88f18d_00d30db8)[lVar12 * 3]);
      (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_00d31228;
      *(undefined4 *)&pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = uVar1
      ;
      *(undefined4 *)
       ((long)&pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) = uVar2;
      pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)local_c0;
      tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
      if (local_98 != (GetBooleanVerifier *)local_88) {
        operator_delete(local_98,local_88._0_8_ + 1);
      }
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != 3);
    lVar12 = local_88._16_8_ + 1;
  } while (local_88._16_8_ == 0);
  local_98 = local_d0->m_verifierBoolean;
  local_90 = local_d0->m_verifierInteger;
  local_88._0_8_ = local_d0->m_verifierInteger64;
  local_88._8_8_ = local_d0->m_verifierFloat;
  lVar12 = 0;
  do {
    pGVar6 = (&local_48)[lVar12];
    pAVar10 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"sample_buffers","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
      local_110 = &local_100;
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,"SAMPLE_BUFFERS");
    (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d31280;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  lVar12 = 0;
  do {
    pGVar6 = (&local_98)[lVar12];
    pAVar10 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"samples","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
      local_110 = &local_100;
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,"SAMPLES");
    (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d312d8;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pTVar13 = (TestContext *)(&local_98)[lVar12];
    pAVar10 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"generate_mipmap_hint","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_110 = &local_100;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,"GENERATE_MIPMAP_HINT");
    (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d31330;
    *(undefined4 *)&pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0x8192;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = pTVar13;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pTVar13 = (TestContext *)(&local_98)[lVar12];
    pAVar10 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"fragment_shader_derivative_hint","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_110 = &local_100;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,"FRAGMENT_SHADER_DERIVATIVE_HINT");
    (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d31330;
    *(undefined4 *)&pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0x8b8b;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = pTVar13;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pGVar6 = (&local_98)[lVar12];
    pAVar10 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"depth_func","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
      local_110 = &local_100;
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,"DEPTH_FUNC");
    (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d31388;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pGVar6 = (&local_98)[lVar12];
    pAVar10 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"cull_face_mode","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
      local_110 = &local_100;
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,"CULL_FACE_MODE");
    (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d313e0;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pGVar6 = (&local_98)[lVar12];
    pAVar10 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"front_face_mode","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
      local_110 = &local_100;
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,"FRONT_FACE");
    (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d31438;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pGVar6 = (&local_98)[lVar12];
    pAVar10 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"viewport","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
      local_110 = &local_100;
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,"VIEWPORT");
    (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d31490;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pGVar6 = (&local_98)[lVar12];
    pAVar10 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"scissor_box","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
      local_110 = &local_100;
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,"SCISSOR_BOX");
    (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d314e8;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pGVar6 = (&local_98)[lVar12];
    pAVar10 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"max_viewport_dims","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
      local_110 = &local_100;
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,"MAX_VIEWPORT_DIMS");
    (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d31540;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pGVar6 = (&local_98)[lVar12];
    pAVar10 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"stencil_ref","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_110 = &local_100;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,"STENCIL_REF");
    (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d31598;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
    *(undefined4 *)&pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0xb97;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pGVar6 = (&local_98)[lVar12];
    pAVar10 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"stencil_back_ref","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_110 = &local_100;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,"STENCIL_BACK_REF");
    (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d31598;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
    *(undefined4 *)&pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0x8ca3;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pGVar6 = (&local_98)[lVar12];
    pAVar10 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"stencil_ref_separate","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_110 = &local_100;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,"STENCIL_REF (separate)");
    (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d315f0;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40400000b97
    ;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pGVar6 = (&local_98)[lVar12];
    pAVar10 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"stencil_ref_separate_both","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_110 = &local_100;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,"STENCIL_REF (separate)");
    (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d315f0;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40800000b97
    ;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pGVar6 = (&local_98)[lVar12];
    pAVar10 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"stencil_back_ref_separate","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_110 = &local_100;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,"STENCIL_BACK_REF (separate)");
    (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d315f0;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40500008ca3
    ;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pGVar6 = (&local_98)[lVar12];
    pAVar10 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"stencil_back_ref_separate_both","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_110 = &local_100;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,"STENCIL_BACK_REF (separate)");
    (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d315f0;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40800008ca3
    ;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  pIVar17 = local_d0;
  do {
    local_88._16_8_ = lVar12;
    local_c8 = (Context *)(&DAT_00d30de0 + lVar12 * 5);
    lVar12 = 0;
    do {
      pGVar6 = (&local_98)[lVar12];
      pAVar10 = (ApiCase *)operator_new(0xa8);
      pCVar4 = (pIVar17->super_TestCaseGroup).m_context;
      local_b8 = &local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"stencil_","");
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_b8);
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_e0 = *plVar15;
        lStack_d8 = plVar11[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar15;
        local_f0 = (long *)*plVar11;
      }
      local_e8 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
      local_110 = &local_100;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_100 = *plVar15;
        lStack_f8 = plVar11[3];
      }
      else {
        local_100 = *plVar15;
        local_110 = (long *)*plVar11;
      }
      local_108 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      uVar1 = *(undefined4 *)((long)local_c8 + 0x10);
      ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,*(char **)((long)local_c8 + 8));
      pIVar17 = local_d0;
      (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_00d31648;
      pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
      *(undefined4 *)&pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = uVar1;
      tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
    lVar12 = 0;
    do {
      pGVar6 = (&local_98)[lVar12];
      pAVar10 = (ApiCase *)operator_new(0xa8);
      pCVar4 = (pIVar17->super_TestCaseGroup).m_context;
      local_b8 = &local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"stencil_back_","");
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_b8);
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_e0 = *plVar15;
        lStack_d8 = plVar11[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar15;
        local_f0 = (long *)*plVar11;
      }
      local_e8 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
      local_110 = &local_100;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_100 = *plVar15;
        lStack_f8 = plVar11[3];
      }
      else {
        local_100 = *plVar15;
        local_110 = (long *)*plVar11;
      }
      local_108 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      uVar1 = *(undefined4 *)((long)local_c8 + 0x20);
      ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,*(char **)((long)local_c8 + 0x18));
      pIVar17 = local_d0;
      (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_00d31648;
      pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
      *(undefined4 *)&pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = uVar1;
      tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
    pTVar13 = (TestContext *)0x0;
    do {
      pGVar6 = (&local_98)[(long)pTVar13];
      local_c0 = (ApiCase *)pTVar13;
      pAVar10 = (ApiCase *)operator_new(0xa8);
      pCVar4 = (pIVar17->super_TestCaseGroup).m_context;
      local_88._24_8_ = local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)(local_88 + 0x18),"stencil_","");
      plVar11 = (long *)std::__cxx11::string::append((char *)(local_88 + 0x18));
      local_b8 = &local_a8;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_a8 = *plVar15;
        lStack_a0 = plVar11[3];
      }
      else {
        local_a8 = *plVar15;
        local_b8 = (long *)*plVar11;
      }
      local_b0 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_b8);
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_e0 = *plVar15;
        lStack_d8 = plVar11[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar15;
        local_f0 = (long *)*plVar11;
      }
      local_e8 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
      local_110 = &local_100;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_100 = *plVar15;
        lStack_f8 = plVar11[3];
      }
      else {
        local_100 = *plVar15;
        local_110 = (long *)*plVar11;
      }
      local_108 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      uVar1 = *(undefined4 *)((long)local_c8 + 0x10);
      ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,*(char **)((long)local_c8 + 8));
      pIVar17 = local_d0;
      pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
      *(undefined4 *)&pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = uVar1;
      (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_00d316a8;
      *(undefined4 *)((long)&pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4)
           = 0x408;
      tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if ((long *)local_88._24_8_ != local_60) {
        operator_delete((void *)local_88._24_8_,local_60[0] + 1);
      }
      pTVar13 = (TestContext *)((long)&local_c0->super_TestCase + 1);
    } while (pTVar13 != (TestContext *)0x4);
    lVar12 = 0;
    do {
      pGVar6 = (&local_98)[lVar12];
      pAVar10 = (ApiCase *)operator_new(0xa8);
      pCVar4 = (pIVar17->super_TestCaseGroup).m_context;
      local_88._24_8_ = local_60;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_88 + 0x18),"stencil_back_","");
      plVar11 = (long *)std::__cxx11::string::append((char *)(local_88 + 0x18));
      local_b8 = &local_a8;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_a8 = *plVar15;
        lStack_a0 = plVar11[3];
      }
      else {
        local_a8 = *plVar15;
        local_b8 = (long *)*plVar11;
      }
      local_b0 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_b8);
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_e0 = *plVar15;
        lStack_d8 = plVar11[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar15;
        local_f0 = (long *)*plVar11;
      }
      local_e8 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
      local_110 = &local_100;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_100 = *plVar15;
        lStack_f8 = plVar11[3];
      }
      else {
        local_100 = *plVar15;
        local_110 = (long *)*plVar11;
      }
      local_108 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      uVar1 = *(undefined4 *)((long)local_c8 + 0x20);
      ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,*(char **)((long)local_c8 + 0x18));
      pIVar17 = local_d0;
      pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
      *(undefined4 *)&pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = uVar1;
      (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_00d316a8;
      *(undefined4 *)((long)&pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4)
           = 0x408;
      tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if ((long *)local_88._24_8_ != local_60) {
        operator_delete((void *)local_88._24_8_,local_60[0] + 1);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
    lVar12 = 0;
    do {
      pGVar6 = (&local_98)[lVar12];
      pAVar10 = (ApiCase *)operator_new(0xa8);
      pCVar4 = (pIVar17->super_TestCaseGroup).m_context;
      local_88._24_8_ = local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)(local_88 + 0x18),"stencil_","");
      plVar11 = (long *)std::__cxx11::string::append((char *)(local_88 + 0x18));
      local_b8 = &local_a8;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_a8 = *plVar15;
        lStack_a0 = plVar11[3];
      }
      else {
        local_a8 = *plVar15;
        local_b8 = (long *)*plVar11;
      }
      local_b0 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_b8);
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_e0 = *plVar15;
        lStack_d8 = plVar11[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar15;
        local_f0 = (long *)*plVar11;
      }
      local_e8 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
      local_110 = &local_100;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_100 = *plVar15;
        lStack_f8 = plVar11[3];
      }
      else {
        local_100 = *plVar15;
        local_110 = (long *)*plVar11;
      }
      local_108 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      uVar1 = *(undefined4 *)((long)local_c8 + 0x10);
      ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,*(char **)((long)local_c8 + 8));
      pIVar17 = local_d0;
      pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
      *(undefined4 *)&pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = uVar1;
      (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_00d316a8;
      *(undefined4 *)((long)&pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4)
           = 0x404;
      tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if ((long *)local_88._24_8_ != local_60) {
        operator_delete((void *)local_88._24_8_,local_60[0] + 1);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
    lVar12 = 0;
    do {
      pGVar6 = (&local_98)[lVar12];
      pAVar10 = (ApiCase *)operator_new(0xa8);
      pCVar4 = (pIVar17->super_TestCaseGroup).m_context;
      local_88._24_8_ = local_60;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_88 + 0x18),"stencil_back_","");
      plVar11 = (long *)std::__cxx11::string::append((char *)(local_88 + 0x18));
      local_b8 = &local_a8;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_a8 = *plVar15;
        lStack_a0 = plVar11[3];
      }
      else {
        local_a8 = *plVar15;
        local_b8 = (long *)*plVar11;
      }
      local_b0 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_b8);
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_e0 = *plVar15;
        lStack_d8 = plVar11[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar15;
        local_f0 = (long *)*plVar11;
      }
      local_e8 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
      local_110 = &local_100;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_100 = *plVar15;
        lStack_f8 = plVar11[3];
      }
      else {
        local_100 = *plVar15;
        local_110 = (long *)*plVar11;
      }
      local_108 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      uVar1 = *(undefined4 *)((long)local_c8 + 0x20);
      ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,*(char **)((long)local_c8 + 0x18));
      pIVar17 = local_d0;
      pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
      *(undefined4 *)&pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = uVar1;
      (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_00d316a8;
      *(undefined4 *)((long)&pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4)
           = 0x405;
      tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if ((long *)local_88._24_8_ != local_60) {
        operator_delete((void *)local_88._24_8_,local_60[0] + 1);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
    lVar12 = local_88._16_8_ + 1;
  } while (lVar12 != 3);
  lVar12 = 0;
  do {
    pGVar6 = (&local_98)[lVar12];
    pAVar10 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"stencil_func","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
      local_110 = &local_100;
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,"STENCIL_FUNC");
    (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d31708;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pGVar6 = (&local_98)[lVar12];
    pAVar10 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"stencil_func_separate","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_110 = &local_100;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,"STENCIL_FUNC (separate)");
    (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d31760;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40400000b92
    ;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pGVar6 = (&local_98)[lVar12];
    pAVar10 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"stencil_func_separate_both","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_110 = &local_100;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,"STENCIL_FUNC (separate)");
    (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d31760;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40800000b92
    ;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pGVar6 = (&local_98)[lVar12];
    pAVar10 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"stencil_back_func_separate","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_110 = &local_100;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,"STENCIL_FUNC (separate)");
    (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d31760;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40500008800
    ;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pGVar6 = (&local_98)[lVar12];
    pAVar10 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"stencil_back_func_separate_both","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_110 = &local_100;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,"STENCIL_FUNC (separate)");
    (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d31760;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40800008800
    ;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pGVar6 = (&local_98)[lVar12];
    pAVar10 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"stencil_value_mask","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_110 = &local_100;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,"STENCIL_VALUE_MASK");
    (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d317b8;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
    *(undefined4 *)&pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0xb93;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pGVar6 = (&local_98)[lVar12];
    pAVar10 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"stencil_back_value_mask","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_110 = &local_100;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,"STENCIL_BACK_VALUE_MASK");
    (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d317b8;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
    *(undefined4 *)&pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0x8ca4;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pGVar6 = (&local_98)[lVar12];
    pAVar10 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"stencil_value_mask_separate","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_110 = &local_100;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,"STENCIL_VALUE_MASK (separate)");
    (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d31810;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40400000b93
    ;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pGVar6 = (&local_98)[lVar12];
    pAVar10 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"stencil_value_mask_separate_both","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_110 = &local_100;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,"STENCIL_VALUE_MASK (separate)");
    (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d31810;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40800000b93
    ;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pGVar6 = (&local_98)[lVar12];
    pAVar10 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"stencil_back_value_mask_separate","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_110 = &local_100;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,"STENCIL_BACK_VALUE_MASK (separate)");
    (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d31810;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40500008ca4
    ;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pGVar6 = (&local_98)[lVar12];
    pAVar10 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"stencil_back_value_mask_separate_both","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_110 = &local_100;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,"STENCIL_BACK_VALUE_MASK (separate)");
    (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d31810;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40800008ca4
    ;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pGVar6 = (&local_98)[lVar12];
    pAVar10 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"stencil_writemask","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_110 = &local_100;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,"STENCIL_WRITEMASK");
    (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d31868;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
    *(undefined4 *)&pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0xb98;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pGVar6 = (&local_98)[lVar12];
    pAVar10 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"stencil_back_writemask","")
    ;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_110 = &local_100;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,"STENCIL_BACK_WRITEMASK");
    (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d31868;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
    *(undefined4 *)&pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0x8ca5;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pGVar6 = (&local_98)[lVar12];
    pAVar10 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"stencil_writemask_separate","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_110 = &local_100;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,"STENCIL_WRITEMASK (separate)");
    (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d318c0;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40400000b98
    ;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pGVar6 = (&local_98)[lVar12];
    pAVar10 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"stencil_writemask_separate_both","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_110 = &local_100;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,"STENCIL_WRITEMASK (separate)");
    (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d318c0;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40800000b98
    ;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pGVar6 = (&local_98)[lVar12];
    pAVar10 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"stencil_back_writemask_separate","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_110 = &local_100;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,"STENCIL_BACK_WRITEMASK (separate)");
    (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d318c0;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40500008ca5
    ;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pGVar6 = (&local_98)[lVar12];
    pAVar10 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"stencil_back_writemask_separate_both","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_110 = &local_100;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,"STENCIL_BACK_WRITEMASK (separate)");
    (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d318c0;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40800008ca5
    ;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  pAVar10 = (ApiCase *)0x0;
  do {
    local_c8 = (Context *)(&PTR_anon_var_dwarf_88f516_00d30e60 + (long)pAVar10 * 3);
    lVar12 = 0;
    local_c0 = pAVar10;
    do {
      pGVar6 = (&local_98)[lVar12];
      pAVar10 = (ApiCase *)operator_new(0xa8);
      pCVar4 = (local_d0->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,*(char **)local_c8,(allocator<char> *)&local_b8);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
      local_110 = &local_100;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_100 = *plVar15;
        lStack_f8 = plVar11[3];
      }
      else {
        local_100 = *plVar15;
        local_110 = (long *)*plVar11;
      }
      local_108 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      uVar1 = *(undefined4 *)((long)local_c8 + 0x10);
      uVar2 = *(undefined4 *)((long)local_c8 + 0x14);
      ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,*(undefined **)((long)local_c8 + 8));
      (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_00d31918;
      pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
      *(undefined4 *)&pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = uVar1;
      *(undefined4 *)((long)&pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4)
           = uVar2;
      tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
    pAVar10 = (ApiCase *)
              ((long)&(local_c0->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode + 1);
  } while (pAVar10 != (ApiCase *)0x8);
  lVar12 = 0;
  do {
    pGVar6 = (&local_98)[lVar12];
    pAVar10 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"unpack_alignment","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_110 = &local_100;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,"UNPACK_ALIGNMENT");
    (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d31970;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
    *(undefined4 *)&pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0xcf5;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pGVar6 = (&local_98)[lVar12];
    pAVar10 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"pack_alignment","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_110 = &local_100;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,"PACK_ALIGNMENT");
    (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d31970;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
    *(undefined4 *)&pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0xd05;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  local_88._16_8_ = 0;
  pIVar17 = local_d0;
  do {
    local_c8 = (Context *)(&PTR_anon_var_dwarf_88f606_00d30f20 + local_88._16_8_ * 3);
    lVar12 = 0;
    do {
      pGVar6 = (&local_98)[lVar12];
      pAVar10 = (ApiCase *)operator_new(0xa8);
      local_c0 = (ApiCase *)(pIVar17->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,*(char **)local_c8,(allocator<char> *)&local_b8);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_100 = *plVar15;
        lStack_f8 = plVar11[3];
        local_110 = &local_100;
      }
      else {
        local_100 = *plVar15;
        local_110 = (long *)*plVar11;
      }
      local_108 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      uVar1 = *(undefined4 *)((long)local_c8 + 0x10);
      uVar2 = *(undefined4 *)((long)local_c8 + 0x14);
      ApiCase::ApiCase(pAVar10,(Context *)local_c0,(char *)local_110,
                       *(undefined **)((long)local_c8 + 8));
      (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_00d319c8;
      pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
      *(undefined4 *)&pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = uVar1;
      *(undefined4 *)((long)&pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4)
           = uVar2;
      tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      pIVar17 = local_d0;
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
    lVar12 = 0;
    do {
      pGVar6 = (&local_98)[lVar12];
      pAVar10 = (ApiCase *)operator_new(0xa8);
      local_c0 = (ApiCase *)(pIVar17->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,*(char **)local_c8,(allocator<char> *)(local_88 + 0x18));
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_b8);
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_e0 = *plVar15;
        lStack_d8 = plVar11[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar15;
        local_f0 = (long *)*plVar11;
      }
      local_e8 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_100 = *plVar15;
        lStack_f8 = plVar11[3];
        local_110 = &local_100;
      }
      else {
        local_100 = *plVar15;
        local_110 = (long *)*plVar11;
      }
      local_108 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      uVar1 = *(undefined4 *)((long)local_c8 + 0x10);
      uVar2 = *(undefined4 *)((long)local_c8 + 0x14);
      ApiCase::ApiCase(pAVar10,(Context *)local_c0,(char *)local_110,
                       *(undefined **)((long)local_c8 + 8));
      pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
      *(undefined4 *)&pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = uVar1;
      *(undefined4 *)((long)&pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4)
           = uVar2;
      (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_00d31a28;
      tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      pIVar17 = local_d0;
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
    local_88._16_8_ = local_88._16_8_ + 1;
  } while (local_88._16_8_ != 4);
  lVar12 = 0;
  do {
    local_88._16_8_ = lVar12;
    local_c8 = (Context *)(&PTR_anon_var_dwarf_88f666_00d30f80 + lVar12 * 3);
    lVar12 = 0;
    do {
      pGVar6 = (&local_98)[lVar12];
      pAVar10 = (ApiCase *)operator_new(0xa8);
      local_c0 = (ApiCase *)(pIVar17->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,(char *)local_c8->m_testCtx,(allocator<char> *)&local_b8);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_100 = *plVar15;
        lStack_f8 = plVar11[3];
        local_110 = &local_100;
      }
      else {
        local_100 = *plVar15;
        local_110 = (long *)*plVar11;
      }
      local_108 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      uVar1 = *(undefined4 *)&local_c8->m_contextInfo;
      uVar2 = *(undefined4 *)((long)&local_c8->m_contextInfo + 4);
      ApiCase::ApiCase(pAVar10,(Context *)local_c0,(char *)local_110,(char *)local_c8->m_renderCtx);
      (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_00d31a88;
      pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
      *(undefined4 *)&pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = uVar1;
      *(undefined4 *)((long)&pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4)
           = uVar2;
      tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      pIVar17 = local_d0;
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
    lVar12 = 0;
    do {
      pGVar6 = (&local_98)[lVar12];
      local_c0 = (ApiCase *)operator_new(0xa8);
      pCVar4 = (pIVar17->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,(char *)local_c8->m_testCtx,
                 (allocator<char> *)(local_88 + 0x18));
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_b8);
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_e0 = *plVar15;
        lStack_d8 = plVar11[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar15;
        local_f0 = (long *)*plVar11;
      }
      local_e8 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
      pAVar10 = local_c0;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_100 = *plVar15;
        lStack_f8 = plVar11[3];
        local_110 = &local_100;
      }
      else {
        local_100 = *plVar15;
        local_110 = (long *)*plVar11;
      }
      local_108 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      uVar1 = *(undefined4 *)&local_c8->m_contextInfo;
      uVar2 = *(undefined4 *)((long)&local_c8->m_contextInfo + 4);
      ApiCase::ApiCase(local_c0,pCVar4,(char *)local_110,(char *)local_c8->m_renderCtx);
      pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
      *(undefined4 *)&pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = uVar1;
      *(undefined4 *)((long)&pAVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4)
           = uVar2;
      (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_00d31ae8;
      tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      pIVar17 = local_d0;
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
    lVar12 = local_88._16_8_ + 1;
  } while (local_88._16_8_ == 0);
  lVar12 = 0;
  do {
    local_50 = lVar12;
    lVar16 = 0;
    do {
      pAVar10 = (ApiCase *)(&local_98)[lVar16];
      this_00 = (ApiCase *)operator_new(0xb0);
      local_c8 = (local_d0->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,(char *)(&DAT_00d30fb0)[lVar12 * 4],
                 (allocator<char> *)&local_b8);
      local_c0 = pAVar10;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_100 = *plVar15;
        lStack_f8 = plVar11[3];
        local_110 = &local_100;
      }
      else {
        local_100 = *plVar15;
        local_110 = (long *)*plVar11;
      }
      local_108 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      uVar1 = (&DAT_00d30fc0)[lVar12 * 8];
      uVar2 = (&DAT_00d30fc4)[lVar12 * 8];
      uVar3 = (&DAT_00d30fc8)[lVar12 * 8];
      local_88._16_8_ = lVar16;
      ApiCase::ApiCase(this_00,local_c8,(char *)local_110,(char *)(&DAT_00d30fb8)[lVar12 * 4]);
      (this_00->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_00d31b48;
      this_00[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)local_c0;
      *(undefined4 *)&this_00[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = uVar1;
      *(undefined4 *)((long)&this_00[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4)
           = uVar2;
      *(undefined4 *)
       &this_00[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p = uVar3;
      tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)this_00);
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      lVar16 = local_88._16_8_ + 1;
    } while (lVar16 != 4);
    lVar12 = local_50 + 1;
  } while (lVar12 != 3);
  lVar12 = 0;
  do {
    local_c8 = (Context *)(&DAT_00d31010 + lVar12 * 3);
    lVar16 = 0;
    local_50 = lVar12;
    do {
      uVar1 = *(undefined4 *)((long)init::queryTypes + lVar16);
      local_88._16_8_ = lVar16;
      pTVar14 = (TestNode *)operator_new(0x88);
      pCVar4 = (local_d0->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,*(char **)local_c8,(allocator<char> *)&local_b8);
      local_c0 = (ApiCase *)CONCAT44(local_c0._4_4_,uVar1);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_100 = *plVar15;
        lStack_f8 = plVar11[3];
        local_110 = &local_100;
      }
      else {
        local_100 = *plVar15;
        local_110 = (long *)*plVar11;
      }
      local_108 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      uVar1 = *(undefined4 *)((long)local_c8 + 0x10);
      uVar2 = *(undefined4 *)((long)local_c8 + 0x14);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar14,pCVar4->m_testCtx,(char *)local_110,
                 *(char **)((long)local_c8 + 8));
      pTVar14[1]._vptr_TestNode = (_func_int **)pCVar4;
      *(undefined4 *)&pTVar14[1].m_testCtx = local_c0._0_4_;
      pTVar14->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d31ba0;
      *(undefined4 *)((long)&pTVar14[1].m_testCtx + 4) = uVar1;
      *(undefined4 *)&pTVar14[1].m_name._M_dataplus._M_p = uVar2;
      tcu::TestNode::addChild((TestNode *)local_d0,pTVar14);
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      lVar16 = local_88._16_8_ + 4;
    } while (lVar16 != 0x10);
    lVar12 = local_50 + 1;
  } while (lVar12 != 7);
  lVar12 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::queryTypes + lVar12);
    pTVar14 = (TestNode *)operator_new(0x80);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"element_array_buffer_binding","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_110 = &local_100;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar14,pCVar4->m_testCtx,(char *)local_110,
               "GL_ELEMENT_ARRAY_BUFFER_BINDING");
    pTVar14[1]._vptr_TestNode = (_func_int **)pCVar4;
    *(undefined4 *)&pTVar14[1].m_testCtx = uVar1;
    pTVar14->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d31c50;
    tcu::TestNode::addChild((TestNode *)local_d0,pTVar14);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 4;
  } while (lVar12 != 0x10);
  lVar12 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::queryTypes + lVar12);
    pTVar14 = (TestNode *)operator_new(0x80);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"transform_feedback_binding","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_110 = &local_100;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar14,pCVar4->m_testCtx,(char *)local_110,
               "GL_TRANSFORM_FEEDBACK_BINDING");
    pTVar14[1]._vptr_TestNode = (_func_int **)pCVar4;
    *(undefined4 *)&pTVar14[1].m_testCtx = uVar1;
    pTVar14->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d31ca8;
    tcu::TestNode::addChild((TestNode *)local_d0,pTVar14);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 4;
  } while (lVar12 != 0x10);
  lVar12 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::queryTypes + lVar12);
    pTVar14 = (TestNode *)operator_new(0x80);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"current_program_binding","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_110 = &local_100;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar14,pCVar4->m_testCtx,(char *)local_110,"CURRENT_PROGRAM");
    pTVar14[1]._vptr_TestNode = (_func_int **)pCVar4;
    *(undefined4 *)&pTVar14[1].m_testCtx = uVar1;
    pTVar14->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d31d00;
    tcu::TestNode::addChild((TestNode *)local_d0,pTVar14);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 4;
  } while (lVar12 != 0x10);
  lVar12 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::queryTypes + lVar12);
    pTVar14 = (TestNode *)operator_new(0x80);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"vertex_array_binding","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_110 = &local_100;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar14,pCVar4->m_testCtx,(char *)local_110,"VERTEX_ARRAY_BINDING");
    pTVar14[1]._vptr_TestNode = (_func_int **)pCVar4;
    *(undefined4 *)&pTVar14[1].m_testCtx = uVar1;
    pTVar14->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d31d58;
    tcu::TestNode::addChild((TestNode *)local_d0,pTVar14);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 4;
  } while (lVar12 != 0x10);
  lVar12 = 0;
  do {
    pGVar6 = (&local_98)[lVar12];
    pAVar10 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"stencil_clear_value","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_110 = &local_100;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,"STENCIL_CLEAR_VALUE");
    (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d31db0;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pGVar6 = (&local_98)[lVar12];
    pAVar10 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"active_texture","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_110 = &local_100;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,"ACTIVE_TEXTURE");
    (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d31e08;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::queryTypes + lVar12);
    pTVar14 = (TestNode *)operator_new(0x80);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"renderbuffer_binding","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_110 = &local_100;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar14,pCVar4->m_testCtx,(char *)local_110,"RENDERBUFFER_BINDING");
    pTVar14[1]._vptr_TestNode = (_func_int **)pCVar4;
    *(undefined4 *)&pTVar14[1].m_testCtx = uVar1;
    pTVar14->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d31e60;
    tcu::TestNode::addChild((TestNode *)local_d0,pTVar14);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 4;
  } while (lVar12 != 0x10);
  lVar12 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::queryTypes + lVar12);
    pTVar14 = (TestNode *)operator_new(0x80);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"sampler_binding","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_110 = &local_100;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar14,pCVar4->m_testCtx,(char *)local_110,"SAMPLER_BINDING");
    pTVar14[1]._vptr_TestNode = (_func_int **)pCVar4;
    *(undefined4 *)&pTVar14[1].m_testCtx = uVar1;
    pTVar14->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d31eb8;
    tcu::TestNode::addChild((TestNode *)local_d0,pTVar14);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 4;
  } while (lVar12 != 0x10);
  lVar12 = 0;
  do {
    pAVar10 = (ApiCase *)0x0;
    local_88._16_8_ = lVar12;
    do {
      uVar1 = *(undefined4 *)
               &pAVar10[0x12e4d].super_TestCase.super_TestCase.super_TestNode.m_children.
                super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      pTVar14 = (TestNode *)operator_new(0x88);
      pCVar4 = (local_d0->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,(&PTR_anon_var_dwarf_88f82e_00d310c0)[lVar12 * 3],
                 (allocator<char> *)&local_b8);
      local_c8 = (Context *)CONCAT44(local_c8._4_4_,uVar1);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
      local_110 = &local_100;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_100 = *plVar15;
        lStack_f8 = plVar11[3];
      }
      else {
        local_100 = *plVar15;
        local_110 = (long *)*plVar11;
      }
      local_108 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      uVar1 = (&DAT_00d310d0)[lVar12 * 6];
      uVar2 = (&DAT_00d310d4)[lVar12 * 6];
      local_c0 = pAVar10;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar14,pCVar4->m_testCtx,(char *)local_110,
                 (char *)(&DAT_00d310c8)[lVar12 * 3]);
      pTVar14[1]._vptr_TestNode = (_func_int **)pCVar4;
      *(undefined4 *)&pTVar14[1].m_testCtx = local_c8._0_4_;
      pTVar14->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d31f10;
      *(undefined4 *)((long)&pTVar14[1].m_testCtx + 4) = uVar1;
      *(undefined4 *)&pTVar14[1].m_name._M_dataplus._M_p = uVar2;
      tcu::TestNode::addChild((TestNode *)local_d0,pTVar14);
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      pAVar10 = (ApiCase *)
                ((long)&(local_c0->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode + 4)
      ;
    } while (pAVar10 != (ApiCase *)0x10);
    lVar12 = local_88._16_8_ + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::queryTypes + lVar12);
    pTVar14 = (TestNode *)operator_new(0x80);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"framebuffer_binding","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_110 = &local_100;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar14,pCVar4->m_testCtx,(char *)local_110,
               "DRAW_FRAMEBUFFER_BINDING and READ_FRAMEBUFFER_BINDING");
    pTVar14[1]._vptr_TestNode = (_func_int **)pCVar4;
    *(undefined4 *)&pTVar14[1].m_testCtx = uVar1;
    pTVar14->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d31f68;
    tcu::TestNode::addChild((TestNode *)local_d0,pTVar14);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 4;
  } while (lVar12 != 0x10);
  lVar12 = 0;
  do {
    pGVar6 = (&local_98)[lVar12];
    pAVar10 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"implementation_color_read","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
      local_110 = &local_100;
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,
                     "IMPLEMENTATION_COLOR_READ_TYPE and IMPLEMENTATION_COLOR_READ_FORMAT");
    (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d31fc0;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pGVar6 = (&local_98)[lVar12];
    pAVar10 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"read_buffer","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
      local_110 = &local_100;
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,"READ_BUFFER");
    (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d32018;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pGVar6 = (&local_98)[lVar12];
    pAVar10 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (local_d0->super_TestCaseGroup).m_context;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"draw_buffer","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_100 = *plVar15;
      lStack_f8 = plVar11[3];
      local_110 = &local_100;
    }
    else {
      local_100 = *plVar15;
      local_110 = (long *)*plVar11;
    }
    local_108 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar10,pCVar4,(char *)local_110,"DRAW_BUFFER");
    (pAVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d32070;
    pAVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar6;
    tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pAVar10);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    plVar11 = &local_e0;
    if (local_f0 != plVar11) {
      operator_delete(local_f0,local_e0 + 1);
      plVar11 = extraout_RAX;
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  return (int)plVar11;
}

Assistant:

void IntegerStateQueryTests::init (void)
{
	static const QueryType queryTypes[] =
	{
		QUERY_BOOLEAN,
		QUERY_INTEGER,
		QUERY_INTEGER64,
		QUERY_FLOAT,
	};

	DE_ASSERT(m_verifierBoolean == DE_NULL);
	DE_ASSERT(m_verifierInteger == DE_NULL);
	DE_ASSERT(m_verifierInteger64 == DE_NULL);
	DE_ASSERT(m_verifierFloat == DE_NULL);

	m_verifierBoolean		= new GetBooleanVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierInteger		= new GetIntegerVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierInteger64		= new GetInteger64Verifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierFloat			= new GetFloatVerifier		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());

	const struct LimitedStateInteger
	{
		const char*		name;
		const char*		description;
		GLenum			targetName;
		GLint			value;
	} implementationMinLimits[] =
	{
		{ "subpixel_bits",									"SUBPIXEL_BITS has minimum value of 4",										GL_SUBPIXEL_BITS,									4	},
		{ "max_3d_texture_size",							"MAX_3D_TEXTURE_SIZE has minimum value of 256",								GL_MAX_3D_TEXTURE_SIZE,								256	},
		{ "max_texture_size",								"MAX_TEXTURE_SIZE has minimum value of 2048",								GL_MAX_TEXTURE_SIZE,								2048},
		{ "max_array_texture_layers",						"MAX_ARRAY_TEXTURE_LAYERS has minimum value of 256",						GL_MAX_ARRAY_TEXTURE_LAYERS,						256	},
		{ "max_cube_map_texture_size",						"MAX_CUBE_MAP_TEXTURE_SIZE has minimum value of 2048",						GL_MAX_CUBE_MAP_TEXTURE_SIZE,						2048},
		{ "max_renderbuffer_size",							"MAX_RENDERBUFFER_SIZE has minimum value of 2048",							GL_MAX_RENDERBUFFER_SIZE,							2048},
		{ "max_draw_buffers",								"MAX_DRAW_BUFFERS has minimum value of 4",									GL_MAX_DRAW_BUFFERS,								4	},
		{ "max_color_attachments",							"MAX_COLOR_ATTACHMENTS has minimum value of 4",								GL_MAX_COLOR_ATTACHMENTS,							4	},
		{ "max_elements_indices",							"MAX_ELEMENTS_INDICES has minimum value of 0",								GL_MAX_ELEMENTS_INDICES,							0	},
		{ "max_elements_vertices",							"MAX_ELEMENTS_VERTICES has minimum value of 0",								GL_MAX_ELEMENTS_VERTICES,							0	},
		{ "num_extensions",									"NUM_EXTENSIONS has minimum value of 0",									GL_NUM_EXTENSIONS,									0	},
		{ "major_version",									"MAJOR_VERSION has minimum value of 3",										GL_MAJOR_VERSION,									3	},
		{ "minor_version",									"MINOR_VERSION has minimum value of 0",										GL_MINOR_VERSION,									0	},
		{ "max_vertex_attribs",								"MAX_VERTEX_ATTRIBS has minimum value of 16",								GL_MAX_VERTEX_ATTRIBS,								16	},
		{ "max_vertex_uniform_components",					"MAX_VERTEX_UNIFORM_COMPONENTS has minimum value of 1024",					GL_MAX_VERTEX_UNIFORM_COMPONENTS,					1024},
		{ "max_vertex_uniform_vectors",						"MAX_VERTEX_UNIFORM_VECTORS has minimum value of 256",						GL_MAX_VERTEX_UNIFORM_VECTORS,						256	},
		{ "max_vertex_uniform_blocks",						"MAX_VERTEX_UNIFORM_BLOCKS has minimum value of 12",						GL_MAX_VERTEX_UNIFORM_BLOCKS,						12	},
		{ "max_vertex_output_components",					"MAX_VERTEX_OUTPUT_COMPONENTS has minimum value of 64",						GL_MAX_VERTEX_OUTPUT_COMPONENTS,					64	},
		{ "max_vertex_texture_image_units",					"MAX_VERTEX_TEXTURE_IMAGE_UNITS has minimum value of 16",					GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS,					16	},
		{ "max_fragment_uniform_components",				"MAX_FRAGMENT_UNIFORM_COMPONENTS has minimum value of 896",					GL_MAX_FRAGMENT_UNIFORM_COMPONENTS,					896	},
		{ "max_fragment_uniform_vectors",					"MAX_FRAGMENT_UNIFORM_VECTORS has minimum value of 224",					GL_MAX_FRAGMENT_UNIFORM_VECTORS,					224	},
		{ "max_fragment_uniform_blocks",					"MAX_FRAGMENT_UNIFORM_BLOCKS has minimum value of 12",						GL_MAX_FRAGMENT_UNIFORM_BLOCKS,						12	},
		{ "max_fragment_input_components",					"MAX_FRAGMENT_INPUT_COMPONENTS has minimum value of 60",					GL_MAX_FRAGMENT_INPUT_COMPONENTS,					60	},
		{ "max_texture_image_units",						"MAX_TEXTURE_IMAGE_UNITS has minimum value of 16",							GL_MAX_TEXTURE_IMAGE_UNITS,							16	},
		{ "max_program_texel_offset",						"MAX_PROGRAM_TEXEL_OFFSET has minimum value of 7",							GL_MAX_PROGRAM_TEXEL_OFFSET,						7	},
		{ "max_uniform_buffer_bindings",					"MAX_UNIFORM_BUFFER_BINDINGS has minimum value of 24",						GL_MAX_UNIFORM_BUFFER_BINDINGS,						24	},
		{ "max_combined_uniform_blocks",					"MAX_COMBINED_UNIFORM_BLOCKS has minimum value of 24",						GL_MAX_COMBINED_UNIFORM_BLOCKS,						24	},
		{ "max_varying_components",							"MAX_VARYING_COMPONENTS has minimum value of 60",							GL_MAX_VARYING_COMPONENTS,							60	},
		{ "max_varying_vectors",							"MAX_VARYING_VECTORS has minimum value of 15",								GL_MAX_VARYING_VECTORS,								15	},
		{ "max_combined_texture_image_units",				"MAX_COMBINED_TEXTURE_IMAGE_UNITS has minimum value of 32",					GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS,				32	},
		{ "max_transform_feedback_interleaved_components",	"MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS has minimum value of 64",	GL_MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS,	64	},
		{ "max_transform_feedback_separate_attribs",		"MAX_TRANSFORM_FEEDBACK_SEPARATE_ATTRIBS has minimum value of 4",			GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_ATTRIBS,			4	},
		{ "max_transform_feedback_separate_components",		"MAX_TRANSFORM_FEEDBACK_SEPARATE_COMPONENTS has minimum value of 4",		GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_COMPONENTS,		4	},
		{ "max_samples",									"MAX_SAMPLES has minimum value of 4",										GL_MAX_SAMPLES,										4	},
		{ "red_bits",										"RED_BITS has minimum value of 0",											GL_RED_BITS,										0	},
		{ "green_bits",										"GREEN_BITS has minimum value of 0",										GL_GREEN_BITS,										0	},
		{ "blue_bits",										"BLUE_BITS has minimum value of 0",											GL_BLUE_BITS,										0	},
		{ "alpha_bits",										"ALPHA_BITS has minimum value of 0",										GL_ALPHA_BITS,										0	},
		{ "depth_bits",										"DEPTH_BITS has minimum value of 0",										GL_DEPTH_BITS,										0	},
		{ "stencil_bits",									"STENCIL_BITS has minimum value of 0",										GL_STENCIL_BITS,									0	},
	};
	const LimitedStateInteger implementationMaxLimits[] =
	{
		{ "min_program_texel_offset",						"MIN_PROGRAM_TEXEL_OFFSET has maximum value of -8",							GL_MIN_PROGRAM_TEXEL_OFFSET,						-8	},
		{ "uniform_buffer_offset_alignment",				"UNIFORM_BUFFER_OFFSET_ALIGNMENT has minimum value of 1",					GL_UNIFORM_BUFFER_OFFSET_ALIGNMENT,					256	},
	};

	// \note implementation defined limits have their own tests so just check the conversions to boolean, int64 and float
	StateVerifier* implementationLimitVerifiers[] = {m_verifierBoolean, m_verifierInteger64, m_verifierFloat};

	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(implementationMinLimits); testNdx++)
		FOR_EACH_VERIFIER(implementationLimitVerifiers, addChild(new ConstantMinimumValueTestCase(m_context, verifier, (std::string(implementationMinLimits[testNdx].name) + verifier->getTestNamePostfix()).c_str(), implementationMinLimits[testNdx].description, implementationMinLimits[testNdx].targetName, implementationMinLimits[testNdx].value)));
	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(implementationMaxLimits); testNdx++)
		FOR_EACH_VERIFIER(implementationLimitVerifiers, addChild(new ConstantMaximumValueTestCase(m_context, verifier, (std::string(implementationMaxLimits[testNdx].name) + verifier->getTestNamePostfix()).c_str(), implementationMaxLimits[testNdx].description, implementationMaxLimits[testNdx].targetName, implementationMaxLimits[testNdx].value)));

	StateVerifier* normalVerifiers[] = {m_verifierBoolean, m_verifierInteger, m_verifierInteger64, m_verifierFloat};

	FOR_EACH_VERIFIER(implementationLimitVerifiers, addChild(new SampleBuffersTestCase		(m_context,	 verifier, (std::string("sample_buffers")						+ verifier->getTestNamePostfix()).c_str(),		"SAMPLE_BUFFERS")));

	FOR_EACH_VERIFIER(normalVerifiers, addChild(new SamplesTestCase				(m_context,	 verifier, (std::string("samples")								+ verifier->getTestNamePostfix()).c_str(),		"SAMPLES")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new HintTestCase				(m_context,	 verifier, (std::string("generate_mipmap_hint")					+ verifier->getTestNamePostfix()).c_str(),		"GENERATE_MIPMAP_HINT",				GL_GENERATE_MIPMAP_HINT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new HintTestCase				(m_context,	 verifier, (std::string("fragment_shader_derivative_hint")		+ verifier->getTestNamePostfix()).c_str(),		"FRAGMENT_SHADER_DERIVATIVE_HINT",	GL_FRAGMENT_SHADER_DERIVATIVE_HINT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new DepthFuncTestCase			(m_context,	 verifier, (std::string("depth_func")							+ verifier->getTestNamePostfix()).c_str(),		"DEPTH_FUNC")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new CullFaceTestCase			(m_context,	 verifier, (std::string("cull_face_mode")						+ verifier->getTestNamePostfix()).c_str(),		"CULL_FACE_MODE")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new FrontFaceTestCase			(m_context,	 verifier, (std::string("front_face_mode")						+ verifier->getTestNamePostfix()).c_str(),		"FRONT_FACE")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ViewPortTestCase			(m_context,	 verifier, (std::string("viewport")								+ verifier->getTestNamePostfix()).c_str(),		"VIEWPORT")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ScissorBoxTestCase			(m_context,	 verifier, (std::string("scissor_box")							+ verifier->getTestNamePostfix()).c_str(),		"SCISSOR_BOX")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new MaxViewportDimsTestCase		(m_context,	 verifier, (std::string("max_viewport_dims")					+ verifier->getTestNamePostfix()).c_str(),		"MAX_VIEWPORT_DIMS")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefTestCase			(m_context,	 verifier, (std::string("stencil_ref")							+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_REF",						GL_STENCIL_REF)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefTestCase			(m_context,	 verifier, (std::string("stencil_back_ref")						+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_BACK_REF",					GL_STENCIL_BACK_REF)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefSeparateTestCase	(m_context,	 verifier, (std::string("stencil_ref_separate")					+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_REF (separate)",			GL_STENCIL_REF,			GL_FRONT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefSeparateTestCase	(m_context,	 verifier, (std::string("stencil_ref_separate_both")			+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_REF (separate)",			GL_STENCIL_REF,			GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefSeparateTestCase	(m_context,	 verifier, (std::string("stencil_back_ref_separate")			+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_BACK_REF (separate)",		GL_STENCIL_BACK_REF,	GL_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefSeparateTestCase	(m_context,	 verifier, (std::string("stencil_back_ref_separate_both")		+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_BACK_REF (separate)",		GL_STENCIL_BACK_REF,	GL_FRONT_AND_BACK)));

	const struct NamedStencilOp
	{
		const char*		name;

		const char*		frontDescription;
		GLenum			frontTarget;
		const char*		backDescription;
		GLenum			backTarget;
	} stencilOps[] =
	{
		{ "fail",		"STENCIL_FAIL",				GL_STENCIL_FAIL,			"STENCIL_BACK_FAIL",			GL_STENCIL_BACK_FAIL			},
		{ "depth_fail",	"STENCIL_PASS_DEPTH_FAIL",	GL_STENCIL_PASS_DEPTH_FAIL,	"STENCIL_BACK_PASS_DEPTH_FAIL",	GL_STENCIL_BACK_PASS_DEPTH_FAIL	},
		{ "depth_pass",	"STENCIL_PASS_DEPTH_PASS",	GL_STENCIL_PASS_DEPTH_PASS,	"STENCIL_BACK_PASS_DEPTH_PASS",	GL_STENCIL_BACK_PASS_DEPTH_PASS	}
	};

	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(stencilOps); testNdx++)
	{
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpTestCase			(m_context, verifier, (std::string("stencil_")		+ stencilOps[testNdx].name + verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].frontDescription,	stencilOps[testNdx].frontTarget)));
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpTestCase			(m_context, verifier, (std::string("stencil_back_")	+ stencilOps[testNdx].name + verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].backDescription,	stencilOps[testNdx].backTarget)));

		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpSeparateTestCase	(m_context, verifier, (std::string("stencil_")		+ stencilOps[testNdx].name + "_separate_both"	+ verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].frontDescription,	stencilOps[testNdx].frontTarget,	GL_FRONT_AND_BACK)));
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpSeparateTestCase	(m_context, verifier, (std::string("stencil_back_")	+ stencilOps[testNdx].name + "_separate_both"	+ verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].backDescription,		stencilOps[testNdx].backTarget,		GL_FRONT_AND_BACK)));

		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpSeparateTestCase	(m_context, verifier, (std::string("stencil_")		+ stencilOps[testNdx].name + "_separate"		+ verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].frontDescription,	stencilOps[testNdx].frontTarget,	GL_FRONT)));
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpSeparateTestCase	(m_context, verifier, (std::string("stencil_back_")	+ stencilOps[testNdx].name + "_separate"		+ verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].backDescription,		stencilOps[testNdx].backTarget,		GL_BACK)));
	}

	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilFuncTestCase					(m_context, verifier,	(std::string("stencil_func")								+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_FUNC")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilFuncSeparateTestCase			(m_context, verifier,	(std::string("stencil_func_separate")						+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_FUNC (separate)",				GL_STENCIL_FUNC,				GL_FRONT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilFuncSeparateTestCase			(m_context, verifier,	(std::string("stencil_func_separate_both")					+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_FUNC (separate)",				GL_STENCIL_FUNC,				GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilFuncSeparateTestCase			(m_context, verifier,	(std::string("stencil_back_func_separate")					+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_FUNC (separate)",				GL_STENCIL_BACK_FUNC,			GL_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilFuncSeparateTestCase			(m_context, verifier,	(std::string("stencil_back_func_separate_both")				+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_FUNC (separate)",				GL_STENCIL_BACK_FUNC,			GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskTestCase					(m_context, verifier,	(std::string("stencil_value_mask")							+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_VALUE_MASK",					GL_STENCIL_VALUE_MASK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskTestCase					(m_context, verifier,	(std::string("stencil_back_value_mask")						+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_VALUE_MASK",				GL_STENCIL_BACK_VALUE_MASK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskSeparateTestCase			(m_context, verifier,	(std::string("stencil_value_mask_separate")					+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_VALUE_MASK (separate)",		GL_STENCIL_VALUE_MASK,			GL_FRONT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskSeparateTestCase			(m_context, verifier,	(std::string("stencil_value_mask_separate_both")			+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_VALUE_MASK (separate)",		GL_STENCIL_VALUE_MASK,			GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskSeparateTestCase			(m_context, verifier,	(std::string("stencil_back_value_mask_separate")			+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_VALUE_MASK (separate)",	GL_STENCIL_BACK_VALUE_MASK,		GL_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskSeparateTestCase			(m_context, verifier,	(std::string("stencil_back_value_mask_separate_both")		+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_VALUE_MASK (separate)",	GL_STENCIL_BACK_VALUE_MASK,		GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskTestCase			(m_context, verifier,	(std::string("stencil_writemask")							+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_WRITEMASK",					GL_STENCIL_WRITEMASK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskTestCase			(m_context, verifier,	(std::string("stencil_back_writemask")						+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_WRITEMASK",				GL_STENCIL_BACK_WRITEMASK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskSeparateTestCase	(m_context, verifier,	(std::string("stencil_writemask_separate")					+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_WRITEMASK (separate)",			GL_STENCIL_WRITEMASK,			GL_FRONT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskSeparateTestCase	(m_context, verifier,	(std::string("stencil_writemask_separate_both")				+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_WRITEMASK (separate)",			GL_STENCIL_WRITEMASK,			GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskSeparateTestCase	(m_context, verifier,	(std::string("stencil_back_writemask_separate")				+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_WRITEMASK (separate)",	GL_STENCIL_BACK_WRITEMASK,		GL_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskSeparateTestCase	(m_context, verifier,	(std::string("stencil_back_writemask_separate_both")		+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_WRITEMASK (separate)",	GL_STENCIL_BACK_WRITEMASK,		GL_FRONT_AND_BACK)));

	const struct PixelStoreState
	{
		const char*	name;
		const char*	description;
		GLenum		target;
		int			initialValue;
	} pixelStoreStates[] =
	{
		{ "unpack_image_height","UNPACK_IMAGE_HEIGHT",	GL_UNPACK_IMAGE_HEIGHT,	0 },
		{ "unpack_skip_images",	"UNPACK_SKIP_IMAGES",	GL_UNPACK_SKIP_IMAGES,	0 },
		{ "unpack_row_length",	"UNPACK_ROW_LENGTH",	GL_UNPACK_ROW_LENGTH,	0 },
		{ "unpack_skip_rows",	"UNPACK_SKIP_ROWS",		GL_UNPACK_SKIP_ROWS,	0 },
		{ "unpack_skip_pixels",	"UNPACK_SKIP_PIXELS",	GL_UNPACK_SKIP_PIXELS,	0 },
		{ "pack_row_length",	"PACK_ROW_LENGTH",		GL_PACK_ROW_LENGTH,		0 },
		{ "pack_skip_rows",		"PACK_SKIP_ROWS",		GL_PACK_SKIP_ROWS,		0 },
		{ "pack_skip_pixels",	"PACK_SKIP_PIXELS",		GL_PACK_SKIP_PIXELS,	0 }
	};
	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(pixelStoreStates); testNdx++)
	{
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new PixelStoreTestCase(m_context, verifier, (std::string(pixelStoreStates[testNdx].name) + verifier->getTestNamePostfix()).c_str(), pixelStoreStates[testNdx].description, pixelStoreStates[testNdx].target, pixelStoreStates[testNdx].initialValue)));
	}

	FOR_EACH_VERIFIER(normalVerifiers, addChild(new PixelStoreAlignTestCase(m_context, verifier, (std::string("unpack_alignment")	+ verifier->getTestNamePostfix()).c_str(),	"UNPACK_ALIGNMENT",	GL_UNPACK_ALIGNMENT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new PixelStoreAlignTestCase(m_context, verifier, (std::string("pack_alignment")		+ verifier->getTestNamePostfix()).c_str(),	"PACK_ALIGNMENT",	GL_PACK_ALIGNMENT)));

	const struct BlendColorState
	{
		const char*	name;
		const char*	description;
		GLenum		target;
		int			initialValue;
	} blendColorStates[] =
	{
		{ "blend_src_rgb",		"BLEND_SRC_RGB",	GL_BLEND_SRC_RGB,		GL_ONE	},
		{ "blend_src_alpha",	"BLEND_SRC_ALPHA",	GL_BLEND_SRC_ALPHA,		GL_ONE	},
		{ "blend_dst_rgb",		"BLEND_DST_RGB",	GL_BLEND_DST_RGB,		GL_ZERO	},
		{ "blend_dst_alpha",	"BLEND_DST_ALPHA",	GL_BLEND_DST_ALPHA,		GL_ZERO	}
	};
	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(blendColorStates); testNdx++)
	{
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new BlendFuncTestCase			(m_context, verifier, (std::string(blendColorStates[testNdx].name)					+ verifier->getTestNamePostfix()).c_str(),	blendColorStates[testNdx].description,	blendColorStates[testNdx].target,	blendColorStates[testNdx].initialValue)));
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new BlendFuncSeparateTestCase	(m_context, verifier, (std::string(blendColorStates[testNdx].name) + "_separate"	+ verifier->getTestNamePostfix()).c_str(),	blendColorStates[testNdx].description,	blendColorStates[testNdx].target,	blendColorStates[testNdx].initialValue)));
	}

	const struct BlendEquationState
	{
		const char*	name;
		const char*	description;
		GLenum		target;
		int			initialValue;
	} blendEquationStates[] =
	{
		{ "blend_equation_rgb",		"BLEND_EQUATION_RGB",	GL_BLEND_EQUATION_RGB,		GL_FUNC_ADD	},
		{ "blend_equation_alpha",	"BLEND_EQUATION_ALPHA",	GL_BLEND_EQUATION_ALPHA,	GL_FUNC_ADD	}
	};
	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(blendEquationStates); testNdx++)
	{
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new BlendEquationTestCase			(m_context, verifier, (std::string(blendEquationStates[testNdx].name) +				+ verifier->getTestNamePostfix()).c_str(),		blendEquationStates[testNdx].description,	blendEquationStates[testNdx].target,	blendEquationStates[testNdx].initialValue)));
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new BlendEquationSeparateTestCase	(m_context, verifier, (std::string(blendEquationStates[testNdx].name) + "_separate"	+ verifier->getTestNamePostfix()).c_str(),		blendEquationStates[testNdx].description,	blendEquationStates[testNdx].target,	blendEquationStates[testNdx].initialValue)));
	}

	const struct ImplementationArrayReturningState
	{
		const char*	name;
		const char*	description;
		GLenum		target;
		GLenum		targetLengthTarget;
		int			minLength;
	} implementationArrayReturningStates[] =
	{
		{ "compressed_texture_formats",		"COMPRESSED_TEXTURE_FORMATS",	GL_COMPRESSED_TEXTURE_FORMATS,	GL_NUM_COMPRESSED_TEXTURE_FORMATS,	10	},
		{ "program_binary_formats",			"PROGRAM_BINARY_FORMATS",		GL_PROGRAM_BINARY_FORMATS,		GL_NUM_PROGRAM_BINARY_FORMATS,		0	},
		{ "shader_binary_formats",			"SHADER_BINARY_FORMATS",		GL_SHADER_BINARY_FORMATS,		GL_NUM_SHADER_BINARY_FORMATS,		0	}
	};
	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(implementationArrayReturningStates); testNdx++)
	{
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new ImplementationArrayTestCase(m_context, verifier, (std::string(implementationArrayReturningStates[testNdx].name) + verifier->getTestNamePostfix()).c_str(), implementationArrayReturningStates[testNdx].description,	implementationArrayReturningStates[testNdx].target,	implementationArrayReturningStates[testNdx].targetLengthTarget,	implementationArrayReturningStates[testNdx].minLength)));
	}

	const struct BufferBindingState
	{
		const char*	name;
		const char*	description;
		GLenum		target;
		GLenum		type;
	} bufferBindingStates[] =
	{
		{ "array_buffer_binding",				"ARRAY_BUFFER_BINDING",					GL_ARRAY_BUFFER_BINDING,				GL_ARRAY_BUFFER				},
		{ "uniform_buffer_binding",				"UNIFORM_BUFFER_BINDING",				GL_UNIFORM_BUFFER_BINDING,				GL_UNIFORM_BUFFER			},
		{ "pixel_pack_buffer_binding",			"PIXEL_PACK_BUFFER_BINDING",			GL_PIXEL_PACK_BUFFER_BINDING,			GL_PIXEL_PACK_BUFFER		},
		{ "pixel_unpack_buffer_binding",		"PIXEL_UNPACK_BUFFER_BINDING",			GL_PIXEL_UNPACK_BUFFER_BINDING,			GL_PIXEL_UNPACK_BUFFER		},
		{ "transform_feedback_buffer_binding",	"TRANSFORM_FEEDBACK_BUFFER_BINDING",	GL_TRANSFORM_FEEDBACK_BUFFER_BINDING,	GL_TRANSFORM_FEEDBACK_BUFFER},
		{ "copy_read_buffer_binding",			"COPY_READ_BUFFER_BINDING",				GL_COPY_READ_BUFFER_BINDING,			GL_COPY_READ_BUFFER			},
		{ "copy_write_buffer_binding",			"COPY_WRITE_BUFFER_BINDING",			GL_COPY_WRITE_BUFFER_BINDING,			GL_COPY_WRITE_BUFFER		}
	};
	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(bufferBindingStates); testNdx++)
	{
		FOR_EACH_QUERYTYPE(queryTypes, addChild(new BufferBindingTestCase(m_context, queryType, (std::string(bufferBindingStates[testNdx].name) + getQueryTypeSuffix(queryType)).c_str(), bufferBindingStates[testNdx].description, bufferBindingStates[testNdx].target, bufferBindingStates[testNdx].type)));
	}

	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new ElementArrayBufferBindingTestCase	(m_context, queryType, (std::string("element_array_buffer_binding")	+ getQueryTypeSuffix(queryType)).c_str())));
	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new TransformFeedbackBindingTestCase	(m_context, queryType, (std::string("transform_feedback_binding")	+ getQueryTypeSuffix(queryType)).c_str())));
	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new CurrentProgramBindingTestCase		(m_context, queryType, (std::string("current_program_binding")		+ getQueryTypeSuffix(queryType)).c_str(),	"CURRENT_PROGRAM")));
	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new VertexArrayBindingTestCase			(m_context, queryType, (std::string("vertex_array_binding")			+ getQueryTypeSuffix(queryType)).c_str(),	"VERTEX_ARRAY_BINDING")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilClearValueTestCase			(m_context, verifier, (std::string("stencil_clear_value")			+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_CLEAR_VALUE")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ActiveTextureTestCase				(m_context, verifier, (std::string("active_texture")				+ verifier->getTestNamePostfix()).c_str(),	"ACTIVE_TEXTURE")));
	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new RenderbufferBindingTestCase			(m_context, queryType, (std::string("renderbuffer_binding")			+ getQueryTypeSuffix(queryType)).c_str(),	"RENDERBUFFER_BINDING")));
	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new SamplerObjectBindingTestCase		(m_context, queryType, (std::string("sampler_binding")				+ getQueryTypeSuffix(queryType)).c_str(),	"SAMPLER_BINDING")));

	const struct TextureBinding
	{
		const char*	name;
		const char*	description;
		GLenum		target;
		GLenum		type;
	} textureBindings[] =
	{
		{ "texture_binding_2d",			"TEXTURE_BINDING_2D",		GL_TEXTURE_BINDING_2D,			GL_TEXTURE_2D		},
		{ "texture_binding_3d",			"TEXTURE_BINDING_3D",		GL_TEXTURE_BINDING_3D,			GL_TEXTURE_3D		},
		{ "texture_binding_2d_array",	"TEXTURE_BINDING_2D_ARRAY",	GL_TEXTURE_BINDING_2D_ARRAY,	GL_TEXTURE_2D_ARRAY	},
		{ "texture_binding_cube_map",	"TEXTURE_BINDING_CUBE_MAP",	GL_TEXTURE_BINDING_CUBE_MAP,	GL_TEXTURE_CUBE_MAP	}
	};

	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(textureBindings); testNdx++)
	{
		FOR_EACH_QUERYTYPE(queryTypes, addChild(new TextureBindingTestCase(m_context, queryType, (std::string(textureBindings[testNdx].name) + getQueryTypeSuffix(queryType)).c_str(), textureBindings[testNdx].description, textureBindings[testNdx].target, textureBindings[testNdx].type)));
	}


	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new FrameBufferBindingTestCase		(m_context, queryType, (std::string("framebuffer_binding")			+ getQueryTypeSuffix(queryType)).c_str(),	"DRAW_FRAMEBUFFER_BINDING and READ_FRAMEBUFFER_BINDING")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ImplementationColorReadTestCase	(m_context, verifier, (std::string("implementation_color_read")		+ verifier->getTestNamePostfix()).c_str(),	"IMPLEMENTATION_COLOR_READ_TYPE and IMPLEMENTATION_COLOR_READ_FORMAT")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ReadBufferCase					(m_context, verifier, (std::string("read_buffer")					+ verifier->getTestNamePostfix()).c_str(),	"READ_BUFFER")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new DrawBufferCase					(m_context, verifier, (std::string("draw_buffer")					+ verifier->getTestNamePostfix()).c_str(),	"DRAW_BUFFER")));
}